

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_QLatin1StringView>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_QLatin1StringView> *this)

{
  QString *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char16_t *pcVar5;
  QString *out;
  char16_t *pcVar6;
  QLatin1StringView in;
  
  pQVar1 = (this->a).a;
  if (((pQVar1->d).ptr == (char16_t *)0x0) &&
     ((this->b).m_data == (char *)0x0 && (((this->a).b)->d).ptr == (char16_t *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    out = (this->a).b;
    lVar2 = (out->d).size;
    lVar3 = (pQVar1->d).size;
    lVar4 = (this->b).m_size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar2 + lVar3 + lVar4,Uninitialized);
    pcVar5 = (__return_storage_ptr__->d).ptr;
    pQVar1 = (this->a).a;
    lVar2 = (pQVar1->d).size;
    if (lVar2 != 0) {
      pcVar6 = (pQVar1->d).ptr;
      if (pcVar6 == (char16_t *)0x0) {
        pcVar6 = L"";
      }
      memcpy(pcVar5,pcVar6,lVar2 * 2);
    }
    pcVar5 = pcVar5 + lVar2;
    pQVar1 = (this->a).b;
    lVar2 = (pQVar1->d).size;
    if (lVar2 != 0) {
      pcVar6 = (pQVar1->d).ptr;
      if (pcVar6 == (char16_t *)0x0) {
        pcVar6 = L"";
      }
      memcpy(pcVar5,pcVar6,lVar2 * 2);
    }
    in.m_size = (qsizetype)(pcVar5 + lVar2);
    in.m_data = (char *)(this->b).m_size;
    QAbstractConcatenable::appendLatin1To((QAbstractConcatenable *)(this->b).m_data,in,(QChar *)out)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }